

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O1

void __thiscall AGSSockAPI::Beacon::reset(Beacon *this)

{
  ssize_t sVar1;
  char buffer [8];
  undefined1 auStack_18 [8];
  
  do {
    sVar1 = read((this->data).fd[0],auStack_18,8);
  } while (0 < sVar1);
  return;
}

Assistant:

void Beacon::reset()
{
#if defined(_WIN32) && (IMPL_MODE == 1)
	char buffer[8];
	while (recv(data.fd, buffer, sizeof (buffer), 0) > 0);
#elif defined(_WIN32) && (IMPL_MODE == 2)
	closesocket(data.fd);
	data.fd = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
	setblocking(data.fd, false);
#else
	char buffer[8];
	while (read(data.fd[0], buffer, sizeof (buffer)) > 0);
#endif
}